

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupAndCones(Gia_Man_t *p,int *pAnds,int nAnds,int fTrimPis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_03;
  char *pcVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  p_00 = Vec_PtrAlloc(100);
  p_01 = Vec_PtrAlloc(100);
  p_02 = Vec_PtrAlloc(100);
  uVar10 = 0;
  uVar9 = (ulong)(uint)nAnds;
  if (nAnds < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pGVar5 = Gia_ManObj(p,pAnds[uVar10]);
    Vec_PtrPush(p_02,pGVar5);
  }
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (iVar8 = 0; iVar8 < p_02->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = (Gia_Obj_t *)Vec_PtrEntry(p_02,iVar8);
    Gia_ManDupCones_rec(p,pGVar5,p_00,p_01,p_02);
  }
  Vec_PtrSort(p_00,Gia_ObjCompareByCioId);
  p_03 = Gia_ManStart(p_02->nSize + p_00->nSize + p_01->nSize + 1);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_03->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_03->pSpec = pcVar6;
  p->pObjs->Value = 0;
  iVar8 = 0;
  if (fTrimPis == 0) {
    while ((iVar8 < p->vCis->nSize - p->nRegs &&
           (pGVar5 = Gia_ManCi(p,iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
      uVar4 = Gia_ManAppendCi(p_03);
      pGVar5->Value = uVar4;
      iVar8 = iVar8 + 1;
    }
  }
  else {
    for (; iVar8 < p_00->nSize; iVar8 = iVar8 + 1) {
      pvVar7 = Vec_PtrEntry(p_00,iVar8);
      iVar1 = Gia_ManAppendCi(p_03);
      *(int *)((long)pvVar7 + 8) = iVar1;
    }
  }
  for (iVar8 = 0; iVar8 < p_01->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = (Gia_Obj_t *)Vec_PtrEntry(p_01,iVar8);
    iVar1 = Gia_ObjIsMux(p,pGVar5);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsXor(pGVar5);
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      if (iVar1 == 0) {
        uVar4 = Gia_ManAppendAnd(p_03,iVar2,iVar3);
      }
      else {
        uVar4 = Gia_ManAppendXor(p_03,iVar2,iVar3);
      }
    }
    else {
      iVar1 = Gia_ObjFanin2Copy(p,pGVar5);
      iVar2 = Gia_ObjFanin1Copy(pGVar5);
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      uVar4 = Gia_ManAppendMux(p_03,iVar1,iVar2,iVar3);
    }
    pGVar5->Value = uVar4;
  }
  for (iVar8 = 0; iVar8 < p_02->nSize; iVar8 = iVar8 + 1) {
    pvVar7 = Vec_PtrEntry(p_02,iVar8);
    Gia_ManAppendCo(p_03,*(int *)((long)pvVar7 + 8));
  }
  Gia_ManSetRegNum(p_03,0);
  Vec_PtrFree(p_00);
  Vec_PtrFree(p_01);
  Vec_PtrFree(p_02);
  return p_03;
}

Assistant:

Gia_Man_t * Gia_ManDupAndCones( Gia_Man_t * p, int * pAnds, int nAnds, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nAnds; i++ )
//        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );
        Vec_PtrPush( vRoots, Gia_ManObj(p, pAnds[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
//    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
//        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsMux(p, pObj) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
//        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, pObj->Value );
    // finalize
//    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Gia_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}